

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

State * __thiscall duckdb_re2::DFA::WorkqToCachedState(DFA *this,Workq *q,Workq *mq,uint32_t flag)

{
  int iVar1;
  Prog *pPVar2;
  Inst *pIVar3;
  bool bVar4;
  bool bVar5;
  int *ip;
  int *piVar6;
  _Head_base<0UL,_int_*,_false> _Var7;
  int iVar8;
  MatchKind MVar9;
  uint uVar10;
  uint uVar11;
  int *piVar12;
  long lVar13;
  uint ninst;
  byte bVar14;
  State *pSStack_70;
  uint local_64;
  PODArray<int> inst;
  
  PODArray<int>::PODArray(&inst,q->maxmark_ + q->n_);
  piVar6 = ((_Head_base<0UL,_int_*,_false> *)
           ((long)&(q->super_SparseSet).dense_.ptr_._M_t.
                   super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> + 8))->
           _M_head_impl;
  uVar11 = flag & 0x100;
  bVar5 = false;
  bVar14 = 0;
  local_64 = 0;
  ninst = 0;
  for (piVar12 = piVar6; piVar12 != piVar6 + (q->super_SparseSet).size_; piVar12 = piVar12 + 1) {
    iVar1 = *piVar12;
    if ((bVar14 & 1) == 0) {
      iVar8 = q->n_;
    }
    else if ((this->kind_ == kFirstMatch) || (iVar8 = q->n_, iVar8 <= iVar1)) break;
    if (iVar1 < iVar8) {
      pIVar3 = (this->prog_->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + iVar1;
      if (((pIVar3->out_opcode_ & 7) == 1) && (MVar9 = this->kind_, MVar9 != kManyMatch)) {
        if (MVar9 == kFirstMatch) {
          if ((piVar12 != piVar6) || (bVar4 = Prog::Inst::greedy(pIVar3,this->prog_), !bVar4))
          goto LAB_01b1d642;
          MVar9 = this->kind_;
        }
        if (MVar9 == kLongestMatch) {
          if (uVar11 != 0 && !bVar5) {
LAB_01b1d7ca:
            pSStack_70 = (State *)0x2;
            goto LAB_01b1d7ae;
          }
        }
        else if (uVar11 != 0) goto LAB_01b1d7ca;
      }
LAB_01b1d642:
      pPVar2 = this->prog_;
      if ((((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
           ((long)&(pPVar2->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
           + 8))->_M_head_impl[(long)iVar1 + -1].out_opcode_ & 8) != 0) {
        lVar13 = (long)(int)ninst;
        ninst = ninst + 1;
        inst.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
        super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar13] = *piVar12;
      }
      uVar10 = pIVar3->out_opcode_ & 7;
      if (uVar10 == 5) {
        bVar14 = bVar14 | pPVar2->anchor_end_ ^ 1U;
      }
      else if (uVar10 == 4) {
        local_64 = local_64 | (pIVar3->field_1).out1_;
      }
    }
    else if ((0 < (int)ninst) &&
            (inst.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
             super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl[(ulong)ninst - 1] != -1)) {
      inst.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
      super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl[ninst] = -1;
      bVar5 = true;
      ninst = ninst + 1;
    }
    piVar6 = ((_Head_base<0UL,_int_*,_false> *)
             ((long)&(q->super_SparseSet).dense_.ptr_._M_t.
                     super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                     super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> + 8))->
             _M_head_impl;
  }
  if ((0 < (int)ninst) &&
     (inst.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
      super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl[ninst - 1] == -1)) {
    ninst = ninst - 1;
  }
  if (local_64 == 0) {
    flag = uVar11;
  }
  if (ninst == 0 && flag == 0) {
    pSStack_70 = (State *)0x1;
  }
  else {
    MVar9 = this->kind_;
    if (MVar9 == kLongestMatch) {
      piVar6 = inst.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
               super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl + (int)ninst;
      _Var7._M_head_impl =
           inst.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
      while (piVar12 = _Var7._M_head_impl, _Var7._M_head_impl < piVar6) {
        for (; (piVar12 < piVar6 && (*piVar12 != -1)); piVar12 = piVar12 + 1) {
        }
        std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(_Var7._M_head_impl,piVar12);
        _Var7._M_head_impl = piVar12 + (piVar12 < piVar6);
      }
      MVar9 = this->kind_;
    }
    if (MVar9 == kManyMatch) {
      std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>
                (inst.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl,
                 inst.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl + (int)ninst);
    }
    if (mq != (Workq *)0x0) {
      inst.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
      super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)ninst] = -2;
      pPVar2 = this->prog_;
      piVar6 = ((_Head_base<0UL,_int_*,_false> *)
               ((long)&(mq->super_SparseSet).dense_.ptr_._M_t.
                       super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                       super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> + 8))->
               _M_head_impl;
      ninst = ninst + 1;
      for (piVar12 = piVar6; piVar12 != piVar6 + (mq->super_SparseSet).size_; piVar12 = piVar12 + 1)
      {
        pIVar3 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
                 ((long)&(pPVar2->inst_).ptr_._M_t.
                         super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 + 8))->_M_head_impl;
        if ((pIVar3[*piVar12].out_opcode_ & 7) == 5) {
          lVar13 = (long)(int)ninst;
          ninst = ninst + 1;
          *(anon_union_4_5_a14c903b_for_Inst_2 *)
           (inst.ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
            super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl + lVar13) = pIVar3[*piVar12].field_1;
        }
      }
    }
    pSStack_70 = CachedState(this,inst.ptr_._M_t.
                                  super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                                  super__Head_base<0UL,_int_*,_false>._M_head_impl,ninst,
                             flag | local_64 << 0x10);
  }
LAB_01b1d7ae:
  std::unique_ptr<int[],_duckdb_re2::PODArray<int>::Deleter>::~unique_ptr(&inst.ptr_);
  return pSStack_70;
}

Assistant:

DFA::State* DFA::WorkqToCachedState(Workq* q, Workq* mq, uint32_t flag) {
  //mutex_.AssertHeld();

  // Construct array of instruction ids for the new state.
  // Only ByteRange, EmptyWidth, and Match instructions are useful to keep:
  // those are the only operators with any effect in
  // RunWorkqOnEmptyString or RunWorkqOnByte.
  PODArray<int> inst(q->size());
  int n = 0;
  uint32_t needflags = 0;  // flags needed by kInstEmptyWidth instructions
  bool sawmatch = false;   // whether queue contains guaranteed kInstMatch
  bool sawmark = false;    // whether queue contains a Mark

  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    int id = *it;
    if (sawmatch && (kind_ == Prog::kFirstMatch || q->is_mark(id)))
      break;
    if (q->is_mark(id)) {
      if (n > 0 && inst[n-1] != Mark) {
        sawmark = true;
        inst[n++] = Mark;
      }
      continue;
    }
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      case kInstAltMatch:
        // This state will continue to a match no matter what
        // the rest of the input is.  If it is the highest priority match
        // being considered, return the special FullMatchState
        // to indicate that it's all matches from here out.
        if (kind_ != Prog::kManyMatch &&
            (kind_ != Prog::kFirstMatch ||
             (it == q->begin() && ip->greedy(prog_))) &&
            (kind_ != Prog::kLongestMatch || !sawmark) &&
            (flag & kFlagMatch)) {
          return FullMatchState;
        }
        FALLTHROUGH_INTENDED;
      default:
        // Record iff id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        if (prog_->inst(id-1)->last())
          inst[n++] = *it;
        if (ip->opcode() == kInstEmptyWidth)
          needflags |= ip->empty();
        if (ip->opcode() == kInstMatch && !prog_->anchor_end())
          sawmatch = true;
        break;
    }
  }
  DCHECK_LE(n, q->size());
  if (n > 0 && inst[n-1] == Mark)
    n--;

  // If there are no empty-width instructions waiting to execute,
  // then the extra flag bits will not be used, so there is no
  // point in saving them.  (Discarding them reduces the number
  // of distinct states.)
  if (needflags == 0)
    flag &= kFlagMatch;

  // NOTE(rsc): The code above cannot do flag &= needflags,
  // because if the right flags were present to pass the current
  // kInstEmptyWidth instructions, new kInstEmptyWidth instructions
  // might be reached that in turn need different flags.
  // The only sure thing is that if there are no kInstEmptyWidth
  // instructions at all, no flags will be needed.
  // We could do the extra work to figure out the full set of
  // possibly needed flags by exploring past the kInstEmptyWidth
  // instructions, but the check above -- are any flags needed
  // at all? -- handles the most common case.  More fine-grained
  // analysis can only be justified by measurements showing that
  // too many redundant states are being allocated.

  // If there are no Insts in the list, it's a dead state,
  // which is useful to signal with a special pointer so that
  // the execution loop can stop early.  This is only okay
  // if the state is *not* a matching state.
  if (n == 0 && flag == 0) {
    return DeadState;
  }

  // If we're in longest match mode, the state is a sequence of
  // unordered state sets separated by Marks.  Sort each set
  // to canonicalize, to reduce the number of distinct sets stored.
  if (kind_ == Prog::kLongestMatch) {
    int* ip = inst.data();
    int* ep = ip + n;
    while (ip < ep) {
      int* markp = ip;
      while (markp < ep && *markp != Mark)
        markp++;
      std::sort(ip, markp);
      if (markp < ep)
        markp++;
      ip = markp;
    }
  }

  // If we're in many match mode, canonicalize for similar reasons:
  // we have an unordered set of states (i.e. we don't have Marks)
  // and sorting will reduce the number of distinct sets stored.
  if (kind_ == Prog::kManyMatch) {
    int* ip = inst.data();
    int* ep = ip + n;
    std::sort(ip, ep);
  }

  // Append MatchSep and the match IDs in mq if necessary.
  if (mq != NULL) {
    inst[n++] = MatchSep;
    for (Workq::iterator i = mq->begin(); i != mq->end(); ++i) {
      int id = *i;
      Prog::Inst* ip = prog_->inst(id);
      if (ip->opcode() == kInstMatch)
        inst[n++] = ip->match_id();
    }
  }

  // Save the needed empty-width flags in the top bits for use later.
  flag |= needflags << kFlagNeedShift;

  State* state = CachedState(inst.data(), n, flag);
  return state;
}